

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

Bus_Man_t * Bus_ManStart(Abc_Ntk_t *pNtk,SC_Lib *pLib,SC_BusPars *pPars)

{
  char *__s;
  float Area;
  int iVar1;
  int iVar2;
  Bus_Man_t *pBVar3;
  SC_Cell *pSVar4;
  SC_WireLoad *pWL;
  Abc_Obj_t *pObj;
  size_t sVar5;
  char *__dest;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Flt_t *pVVar8;
  Vec_Flt_t *p;
  Vec_Flt_t *p_00;
  Vec_Flt_t *p_01;
  int i;
  float Entry;
  float Entry_00;
  float Entry_01;
  float Entry_02;
  
  pBVar3 = (Bus_Man_t *)calloc(1,0x60);
  pBVar3->pPars = pPars;
  pBVar3->pNtk = pNtk;
  pBVar3->pLib = pLib;
  pSVar4 = Abc_SclFindInvertor(pLib,pPars->fAddBufs);
  pBVar3->pInv = pSVar4->pRepr->pPrev;
  if (pPars->fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      Area = 0.0;
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pObj = Abc_NtkObj(pNtk,iVar2);
        if ((((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
            ((pObj->vFanins).nSize != 0)) && (iVar1 = Abc_ObjIsBarBuf(pObj), iVar1 == 0)) {
          pSVar4 = Abc_SclObjCell(pObj);
          Area = Area + pSVar4->area;
        }
      }
      pWL = Abc_SclFindWireLoadModel(pLib,Area);
      pBVar3->pWLoadUsed = pWL;
      if (pWL == (SC_WireLoad *)0x0) goto LAB_003acc4c;
      __s = pWL->pName;
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar5 = strlen(__s);
        __dest = (char *)malloc(sVar5 + 1);
        strcpy(__dest,__s);
      }
      pNtk->pWLoadUsed = __dest;
    }
    else {
      pWL = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      pBVar3->pWLoadUsed = pWL;
      if (pWL == (SC_WireLoad *)0x0) goto LAB_003acc4c;
    }
    iVar2 = Abc_NtkGetFanoutMax(pNtk);
    pVVar8 = Abc_SclFindWireCaps(pWL,iVar2);
    pBVar3->vWireCaps = pVVar8;
  }
LAB_003acc4c:
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  pBVar3->vFanouts = pVVar6;
  pVVar8 = Vec_FltAlloc(pNtk->vObjs->nSize * 2 + 1000);
  pBVar3->vCins = pVVar8;
  p = Vec_FltAlloc(pNtk->vObjs->nSize * 2 + 1000);
  pBVar3->vETimes = p;
  p_00 = Vec_FltAlloc(pNtk->vObjs->nSize * 2 + 1000);
  pBVar3->vLoads = p_00;
  p_01 = Vec_FltAlloc(pNtk->vObjs->nSize * 2 + 1000);
  pBVar3->vDepts = p_01;
  Vec_FltFill(pVVar8,pNtk->vObjs->nSize,Entry);
  Vec_FltFill(p,pNtk->vObjs->nSize,Entry_00);
  Vec_FltFill(p_00,pNtk->vObjs->nSize,Entry_01);
  Vec_FltFill(p_01,pNtk->vObjs->nSize,Entry_02);
  pNtk->pBSMan = pBVar3;
  return pBVar3;
}

Assistant:

Bus_Man_t * Bus_ManStart( Abc_Ntk_t * pNtk, SC_Lib * pLib, SC_BusPars * pPars )
{
    Bus_Man_t * p;
    p = ABC_CALLOC( Bus_Man_t, 1 );
    p->pPars     = pPars;
    p->pNtk      = pNtk;
    p->pLib      = pLib;
    p->pInv      = Abc_SclFindInvertor(pLib, pPars->fAddBufs)->pRepr->pPrev;//->pAve;
    if ( pPars->fUseWireLoads )
    { 
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    if ( p->pWLoadUsed )
    p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(pNtk) );
    p->vFanouts  = Vec_PtrAlloc( 100 );
    p->vCins     = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vETimes   = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vLoads    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vDepts    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    Vec_FltFill( p->vCins,   Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vETimes, Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vLoads,  Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vDepts,  Abc_NtkObjNumMax(pNtk), 0 );
    pNtk->pBSMan = p;
    return p;
}